

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfilesystemmodel.cpp
# Opt level: O2

QModelIndex * __thiscall
QFileSystemModel::parent
          (QModelIndex *__return_storage_ptr__,QFileSystemModel *this,QModelIndex *index)

{
  QFileSystemModelPrivate *this_00;
  QFileSystemNode *this_01;
  bool bVar1;
  int iVar2;
  QFileSystemNode *pQVar3;
  QFileSystemNode *childName;
  
  this_00 = *(QFileSystemModelPrivate **)&this->field_0x8;
  bVar1 = QAbstractItemModelPrivate::indexValid(&this_00->super_QAbstractItemModelPrivate,index);
  if (bVar1) {
    pQVar3 = QFileSystemModelPrivate::node(this_00,index);
    pQVar3 = pQVar3->parent;
    if (pQVar3 != &this_00->root && pQVar3 != (QFileSystemNode *)0x0) {
      this_01 = pQVar3->parent;
      childName = QHash<QString,_QFileSystemModelPrivate::QFileSystemNode_*>::value
                            (&this_01->children,&pQVar3->fileName);
      iVar2 = QFileSystemModelPrivate::QFileSystemNode::visibleLocation
                        (this_01,&childName->fileName);
      iVar2 = QFileSystemModelPrivate::translateVisibleLocation(this_00,this_01,iVar2);
      if (iVar2 != -1) {
        __return_storage_ptr__->r = iVar2;
        __return_storage_ptr__->c = 0;
        __return_storage_ptr__->i = (quintptr)pQVar3;
        (__return_storage_ptr__->m).ptr = &this->super_QAbstractItemModel;
        return __return_storage_ptr__;
      }
      __return_storage_ptr__->r = -1;
      __return_storage_ptr__->c = -1;
      __return_storage_ptr__->i = 0;
      (__return_storage_ptr__->m).ptr = (QAbstractItemModel *)0x0;
      return __return_storage_ptr__;
    }
  }
  __return_storage_ptr__->r = -1;
  __return_storage_ptr__->c = -1;
  __return_storage_ptr__->i = 0;
  (__return_storage_ptr__->m).ptr = (QAbstractItemModel *)0x0;
  return __return_storage_ptr__;
}

Assistant:

QModelIndex QFileSystemModel::parent(const QModelIndex &index) const
{
    Q_D(const QFileSystemModel);
    if (!d->indexValid(index))
        return QModelIndex();

    QFileSystemModelPrivate::QFileSystemNode *indexNode = d->node(index);
    Q_ASSERT(indexNode != nullptr);
    QFileSystemModelPrivate::QFileSystemNode *parentNode = indexNode->parent;
    if (parentNode == nullptr || parentNode == &d->root)
        return QModelIndex();

    // get the parent's row
    QFileSystemModelPrivate::QFileSystemNode *grandParentNode = parentNode->parent;
    Q_ASSERT(grandParentNode->children.contains(parentNode->fileName));
    int visualRow = d->translateVisibleLocation(grandParentNode, grandParentNode->visibleLocation(grandParentNode->children.value(parentNode->fileName)->fileName));
    if (visualRow == -1)
        return QModelIndex();
    return createIndex(visualRow, 0, parentNode);
}